

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sesschan.c
# Opt level: O2

void sesschan_start_backend(sesschan *sess,char *cmd)

{
  _Bool _Var1;
  LogContext *pLVar2;
  Conf *pCVar3;
  char *pcVar4;
  Backend *pBVar5;
  long lVar6;
  undefined1 *puVar7;
  undefined1 *puVar8;
  byte bVar9;
  undefined1 auStack_a78 [1296];
  char *local_568;
  char **local_560;
  Seat *local_550;
  char *local_548;
  undefined1 local_540 [1296];
  
  bVar9 = 0;
  local_550 = &sess->seat;
  pLVar2 = sess->child_logctx;
  pCVar3 = sess->conf;
  _Var1 = sess->want_pty;
  pcVar4 = sess->ssc->session_starting_dir;
  local_548 = cmd;
  memcpy(local_540,&sess->ttymodes,0x50c);
  puVar7 = local_540;
  puVar8 = auStack_a78;
  for (lVar6 = 0x50c; lVar6 != 0; lVar6 = lVar6 + -1) {
    *puVar8 = *puVar7;
    puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
    puVar8 = puVar8 + (ulong)bVar9 * -2 + 1;
  }
  local_560 = sesschan_start_backend::env_to_unset;
  local_568 = pcVar4;
  pBVar5 = pty_backend_create(local_550,pLVar2,pCVar3,0,local_548,_Var1 ^ 1);
  sess->backend = pBVar5;
  (*pBVar5->vt->size)(pBVar5,sess->wc,sess->hc);
  return;
}

Assistant:

static void sesschan_start_backend(sesschan *sess, const char *cmd)
{
    /*
     * List of environment variables that we should not pass through
     * from the login session Uppity was run in (which, it being a
     * test server, there will usually be one of). These variables
     * will be set as part of X or agent forwarding, and shouldn't be
     * confusingly set in the absence of that.
     *
     * (DISPLAY must also be cleared, but pty.c will do that anyway
     * when our get_x_display method returns NULL.)
     */
    static const char *const env_to_unset[] = {
        "XAUTHORITY", "SSH_AUTH_SOCK", "SSH_AGENT_PID",
        NULL /* terminator */
    };

    sess->backend = pty_backend_create(
        &sess->seat, sess->child_logctx, sess->conf, NULL, cmd,
        sess->ttymodes, !sess->want_pty, sess->ssc->session_starting_dir,
        env_to_unset);
    backend_size(sess->backend, sess->wc, sess->hc);
}